

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  byte *pbVar11;
  long lVar12;
  ulong uVar13;
  ulong *puVar14;
  HUF_CStream_t bitC;
  HUF_CStream_t local_68;
  
  if (dstSize < 8) {
    return 0;
  }
  local_68.bitPos[0] = 0;
  local_68.bitPos[1] = 0;
  local_68.bitContainer[0] = 0;
  local_68.bitContainer[1] = 0;
  local_68.endPtr = (BYTE *)((long)dst + (dstSize - 8));
  if (dstSize == 8) {
    return 0;
  }
  uVar9 = (uint)*CTable;
  uVar7 = (uint)srcSize;
  local_68.ptr = (BYTE *)dst;
  local_68.startPtr = (BYTE *)dst;
  if (0xb < uVar9 || dstSize < ((*CTable & 0xffffffff) * srcSize >> 3) + 8) {
    uVar9 = uVar7 + 3;
    if (-1 < (int)uVar7) {
      uVar9 = uVar7;
    }
    iVar6 = uVar7 - (uVar9 & 0xfffffffc);
    if (0 < iVar6) {
      pbVar11 = (byte *)((long)(int)uVar7 + (long)src);
      iVar6 = iVar6 + 1;
      do {
        pbVar11 = pbVar11 + -1;
        uVar10 = CTable[(ulong)*pbVar11 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        local_68.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        srcSize = (size_t)((int)srcSize - 1);
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      uVar10 = local_68.bitPos[0] & 0xff;
      cVar8 = (char)local_68.bitPos[0];
      local_68.bitPos[0] = (size_t)((uint)local_68.bitPos[0] & 7);
      if (uVar10 == 0) goto LAB_0019354c;
      if (0x40 < (uint)uVar10) goto LAB_00193663;
      local_68.ptr = (BYTE *)dst;
      if (local_68.endPtr < dst) goto LAB_0019356b;
      *(size_t *)dst = local_68.bitContainer[0] >> ((ulong)(byte)-cVar8 & 0x3f);
      local_68.ptr = (BYTE *)((uVar10 >> 3) + (long)dst);
      if (local_68.endPtr < local_68.ptr) {
        local_68.ptr = local_68.endPtr;
      }
    }
    if ((srcSize & 3) != 0) goto LAB_001935e7;
    if ((srcSize & 4) != 0) {
      lVar3 = (long)(int)srcSize;
      lVar12 = 3;
      do {
        uVar10 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar3 + -4) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar10 & 0x3f) | uVar10;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar10 = CTable[(ulong)*(byte *)((long)src + lVar3 + -4) + 1];
      if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
      local_68.bitContainer[0] =
           uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
      uVar10 = uVar10 + local_68.bitPos[0];
      uVar5 = uVar10 & 0xff;
      local_68.bitPos[0] = uVar10;
      if (0x40 < uVar5) goto LAB_0019350e;
      local_68.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar5 == 0) goto LAB_0019354c;
      if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
      srcSize = lVar3 - 4;
      *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar10 & 0x3f);
      local_68.ptr = (BYTE *)((uVar5 >> 3) + (long)local_68.ptr);
      if (local_68.endPtr < local_68.ptr) {
        local_68.ptr = local_68.endPtr;
      }
    }
    if ((srcSize & 7) == 0) {
      if (0 < (int)srcSize) {
        uVar10 = srcSize & 0xffffffff;
        lVar3 = (long)src + (uVar10 - 1);
        lVar12 = (long)src + (uVar10 - 5);
        do {
          lVar4 = 3;
          do {
            uVar5 = CTable[(ulong)*(byte *)(lVar3 + -3 + lVar4) + 1];
            if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
            local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar5 & 0x3f) | uVar5;
            local_68.bitPos[0] = local_68.bitPos[0] + uVar5;
            if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
          uVar5 = CTable[(ulong)*(byte *)((uVar10 - 4) + (long)src) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[0] =
               uVar5 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar5 & 0x3f);
          uVar5 = uVar5 + local_68.bitPos[0];
          uVar13 = uVar5 & 0xff;
          local_68.bitPos[0] = uVar5;
          if (0x40 < uVar13) goto LAB_0019350e;
          local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
          if (uVar13 == 0) goto LAB_0019354c;
          if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
          puVar14 = (ulong *)((uVar13 >> 3) + (long)local_68.ptr);
          if (local_68.endPtr < puVar14) {
            puVar14 = (ulong *)local_68.endPtr;
          }
          *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
          local_68.bitContainer[1] = 0;
          local_68.bitPos[1] = 0;
          lVar4 = 3;
          do {
            uVar5 = CTable[(ulong)*(byte *)(lVar12 + -3 + lVar4) + 1];
            local_68.ptr = (BYTE *)puVar14;
            if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
            local_68.bitContainer[1] = local_68.bitContainer[1] >> (uVar5 & 0x3f) | uVar5;
            local_68.bitPos[1] = local_68.bitPos[1] + uVar5;
            if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
          uVar5 = CTable[(ulong)*(byte *)((long)src + (uVar10 - 8)) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[1] =
               uVar5 & 0xffffffffffffff00 | local_68.bitContainer[1] >> (uVar5 & 0x3f);
          local_68.bitPos[1] = uVar5 + local_68.bitPos[1];
          if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
          if (0x3f < (local_68.bitPos[1] & 0xff)) goto LAB_001935c8;
          local_68.bitContainer[0] =
               local_68.bitContainer[0] >> (local_68.bitPos[1] & 0x3f) | local_68.bitContainer[1];
          uVar5 = local_68.bitPos[1] + local_68.bitPos[0];
          uVar13 = uVar5 & 0xff;
          local_68.bitPos[0] = uVar5;
          if (0x40 < uVar13) goto LAB_001935a9;
          local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
          if (uVar13 == 0) goto LAB_0019354c;
          if (local_68.endPtr < puVar14) goto LAB_0019356b;
          local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)puVar14);
          if (local_68.endPtr < local_68.ptr) {
            local_68.ptr = local_68.endPtr;
          }
          *puVar14 = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
          srcSize = uVar10 - 8;
          lVar3 = lVar3 + -8;
          lVar12 = lVar12 + -8;
          bVar1 = 8 < (long)uVar10;
          uVar10 = srcSize;
        } while (bVar1);
      }
      goto LAB_00191c6d;
    }
LAB_00193606:
    __assert_fail("n % (2 * kUnroll) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3eb4,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  }
  switch(uVar9) {
  case 7:
    uVar9 = uVar7 + 7;
    if (-1 < (int)uVar7) {
      uVar9 = uVar7;
    }
    iVar6 = uVar7 - (uVar9 & 0xfffffff8);
    if (0 < iVar6) {
      pbVar11 = (byte *)((long)(int)uVar7 + (long)src);
      iVar6 = iVar6 + 1;
      do {
        pbVar11 = pbVar11 + -1;
        uVar10 = CTable[(ulong)*pbVar11 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        local_68.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        srcSize = (size_t)((int)srcSize - 1);
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      uVar10 = local_68.bitPos[0] & 0xff;
      cVar8 = (char)local_68.bitPos[0];
      local_68.bitPos[0] = (size_t)((uint)local_68.bitPos[0] & 7);
      if (uVar10 == 0) goto LAB_0019354c;
      if (0x40 < (uint)uVar10) {
LAB_00193663:
        __assert_fail("nbBits <= sizeof(bitC->bitContainer[0]) * 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6e,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      if (local_68.endPtr < dst) goto LAB_0019356b;
      *(size_t *)dst = local_68.bitContainer[0] >> ((ulong)(byte)-cVar8 & 0x3f);
      local_68.ptr = (BYTE *)((uVar10 >> 3) + (long)dst);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
    }
    if ((srcSize & 7) != 0) goto LAB_001935e7;
    if ((srcSize & 8) != 0) {
      lVar3 = (long)(int)srcSize;
      lVar12 = 7;
      do {
        uVar10 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar3 + -8) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar10 & 0x3f) | uVar10;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar10 = CTable[(ulong)*(byte *)((long)src + lVar3 + -8) + 1];
      if (0xc < (uVar10 & 0xff)) {
LAB_0019352d:
        __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e2b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
      }
      local_68.bitContainer[0] =
           uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
      uVar10 = uVar10 + local_68.bitPos[0];
      uVar5 = uVar10 & 0xff;
      local_68.bitPos[0] = uVar10;
      if (0x40 < uVar5) {
LAB_0019350e:
        __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e37,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
      }
      local_68.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar5 == 0) {
LAB_0019354c:
        __assert_fail("nbBits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6d,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      if (local_68.endPtr < local_68.ptr) {
LAB_0019356b:
        __assert_fail("bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e6f,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar10 & 0x3f);
      local_68.ptr = (BYTE *)((uVar5 >> 3) + (long)local_68.ptr);
      if (local_68.endPtr < local_68.ptr) {
LAB_0019358a:
        __assert_fail("!kFast || bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3e72,"void HUF_flushBits(HUF_CStream_t *, int)");
      }
      srcSize = lVar3 - 8;
    }
    if ((srcSize & 0xf) != 0) goto LAB_00193606;
    if (0 < (int)srcSize) {
      uVar10 = srcSize & 0xffffffff;
      lVar3 = (long)src + (uVar10 - 1);
      lVar12 = (long)src + (uVar10 - 9);
      do {
        lVar4 = 7;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar3 + -7 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[0] = local_68.bitPos[0] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((uVar10 - 8) + (long)src) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] =
             uVar5 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar5 & 0x3f);
        uVar5 = uVar5 + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) goto LAB_0019350e;
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        local_68.bitContainer[1] = 0;
        local_68.bitPos[1] = 0;
        lVar4 = 7;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar12 + -7 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[1] = local_68.bitContainer[1] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[1] = local_68.bitPos[1] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((long)src + (uVar10 - 0x10)) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[1] =
             uVar5 & 0xffffffffffffff00 | local_68.bitContainer[1] >> (uVar5 & 0x3f);
        local_68.bitPos[1] = uVar5 + local_68.bitPos[1];
        if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
        if (0x3f < (local_68.bitPos[1] & 0xff)) {
LAB_001935c8:
          __assert_fail("(bitC->bitPos[1] & 0xFF) < HUF_BITS_IN_CONTAINER",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3e56,"void HUF_mergeIndex1(HUF_CStream_t *)");
        }
        local_68.bitContainer[0] =
             local_68.bitContainer[0] >> (local_68.bitPos[1] & 0x3f) | local_68.bitContainer[1];
        uVar5 = local_68.bitPos[1] + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) {
LAB_001935a9:
          __assert_fail("(bitC->bitPos[0] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3e5a,"void HUF_mergeIndex1(HUF_CStream_t *)");
        }
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        srcSize = uVar10 - 0x10;
        lVar3 = lVar3 + -0x10;
        lVar12 = lVar12 + -0x10;
        bVar1 = 0x10 < (long)uVar10;
        uVar10 = srcSize;
      } while (bVar1);
    }
    break;
  case 8:
    if (0 < (int)uVar7 % 7) {
      pbVar11 = (byte *)((long)(int)uVar7 + (long)src);
      iVar6 = (int)uVar7 % 7 + 1;
      do {
        pbVar11 = pbVar11 + -1;
        uVar10 = CTable[(ulong)*pbVar11 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        local_68.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        srcSize = (size_t)((int)srcSize - 1);
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      uVar10 = local_68.bitPos[0] & 0xff;
      cVar8 = (char)local_68.bitPos[0];
      local_68.bitPos[0] = (size_t)((uint)local_68.bitPos[0] & 7);
      if (uVar10 == 0) goto LAB_0019354c;
      if (0x40 < (uint)uVar10) goto LAB_00193663;
      if (local_68.endPtr < dst) goto LAB_0019356b;
      *(size_t *)dst = local_68.bitContainer[0] >> ((ulong)(byte)-cVar8 & 0x3f);
      local_68.ptr = (BYTE *)((uVar10 >> 3) + (long)dst);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
    }
    iVar6 = (int)srcSize;
    uVar7 = iVar6 * -0x49249249 + 0x12492492;
    if (uVar7 < 0x24924925) {
      if (0x12492492 < (uVar7 >> 1 | iVar6 * -0x80000000)) {
        lVar3 = (long)iVar6;
        lVar12 = 6;
        do {
          uVar10 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar3 + -7) + 1];
          if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar10 & 0x3f) | uVar10;
          local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
          if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar10 = CTable[(ulong)*(byte *)((long)src + lVar3 + -7) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
        uVar10 = uVar10 + local_68.bitPos[0];
        uVar5 = uVar10 & 0xff;
        local_68.bitPos[0] = uVar10;
        if (0x40 < uVar5) goto LAB_0019350e;
        local_68.bitPos[0] = (size_t)((uint)uVar10 & 7);
        if (uVar5 == 0) goto LAB_0019354c;
        if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar10 & 0x3f);
        local_68.ptr = (BYTE *)((uVar5 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        srcSize = lVar3 - 7;
      }
      iVar6 = (int)srcSize;
      if ((iVar6 * -0x49249249 + 0x12492492U >> 1 | iVar6 * -0x80000000) < 0x12492493) {
        if (0 < iVar6) {
          uVar10 = srcSize & 0xffffffff;
          lVar3 = (long)src + (uVar10 - 1);
          lVar12 = (long)src + (uVar10 - 8);
          do {
            lVar4 = 6;
            do {
              uVar5 = CTable[(ulong)*(byte *)(lVar3 + -6 + lVar4) + 1];
              if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
              local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar5 & 0x3f) | uVar5;
              local_68.bitPos[0] = local_68.bitPos[0] + uVar5;
              if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
            uVar5 = CTable[(ulong)*(byte *)((uVar10 - 7) + (long)src) + 1];
            if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
            local_68.bitContainer[0] =
                 uVar5 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar5 & 0x3f);
            uVar5 = uVar5 + local_68.bitPos[0];
            uVar13 = uVar5 & 0xff;
            local_68.bitPos[0] = uVar5;
            if (0x40 < uVar13) goto LAB_0019350e;
            local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
            if (uVar13 == 0) goto LAB_0019354c;
            if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
            *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f)
            ;
            local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
            if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
            local_68.bitContainer[1] = 0;
            local_68.bitPos[1] = 0;
            lVar4 = 6;
            do {
              uVar5 = CTable[(ulong)*(byte *)(lVar12 + -6 + lVar4) + 1];
              if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
              local_68.bitContainer[1] = local_68.bitContainer[1] >> (uVar5 & 0x3f) | uVar5;
              local_68.bitPos[1] = local_68.bitPos[1] + uVar5;
              if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
            uVar5 = CTable[(ulong)*(byte *)((long)src + (uVar10 - 0xe)) + 1];
            if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
            local_68.bitContainer[1] =
                 uVar5 & 0xffffffffffffff00 | local_68.bitContainer[1] >> (uVar5 & 0x3f);
            local_68.bitPos[1] = uVar5 + local_68.bitPos[1];
            if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
            if (0x3f < (local_68.bitPos[1] & 0xff)) goto LAB_001935c8;
            local_68.bitContainer[0] =
                 local_68.bitContainer[0] >> (local_68.bitPos[1] & 0x3f) | local_68.bitContainer[1];
            uVar5 = local_68.bitPos[1] + local_68.bitPos[0];
            uVar13 = uVar5 & 0xff;
            local_68.bitPos[0] = uVar5;
            if (0x40 < uVar13) goto LAB_001935a9;
            local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
            if (uVar13 == 0) goto LAB_0019354c;
            *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f)
            ;
            local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
            if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
            srcSize = uVar10 - 0xe;
            lVar3 = lVar3 + -0xe;
            lVar12 = lVar12 + -0xe;
            bVar1 = 0xe < (long)uVar10;
            uVar10 = srcSize;
          } while (bVar1);
        }
        break;
      }
      goto LAB_00193606;
    }
LAB_001935e7:
    __assert_fail("n % kUnroll == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3ea8,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  case 9:
    if (0 < (int)uVar7 % 6) {
      pbVar11 = (byte *)((long)(int)uVar7 + (long)src);
      iVar6 = (int)uVar7 % 6 + 1;
      do {
        pbVar11 = pbVar11 + -1;
        uVar10 = CTable[(ulong)*pbVar11 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        local_68.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        srcSize = (size_t)((int)srcSize - 1);
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      uVar10 = local_68.bitPos[0] & 0xff;
      cVar8 = (char)local_68.bitPos[0];
      local_68.bitPos[0] = (size_t)((uint)local_68.bitPos[0] & 7);
      if (uVar10 == 0) goto LAB_0019354c;
      if (0x40 < (uint)uVar10) goto LAB_00193663;
      if (local_68.endPtr < dst) goto LAB_0019356b;
      *(size_t *)dst = local_68.bitContainer[0] >> ((ulong)(byte)-cVar8 & 0x3f);
      local_68.ptr = (BYTE *)((uVar10 >> 3) + (long)dst);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
    }
    iVar6 = (int)srcSize;
    if (0x2aaaaaaa < (iVar6 * -0x55555555 + 0x2aaaaaaaU >> 1 | iVar6 * -0x80000000))
    goto LAB_001935e7;
    if (0x15555554 < (iVar6 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar6 * -0x40000000)) {
      lVar3 = (long)iVar6;
      lVar12 = 5;
      do {
        uVar10 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar3 + -6) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar10 & 0x3f) | uVar10;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar10 = CTable[(ulong)*(byte *)((long)src + lVar3 + -6) + 1];
      if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
      local_68.bitContainer[0] =
           uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
      uVar10 = uVar10 + local_68.bitPos[0];
      uVar5 = uVar10 & 0xff;
      local_68.bitPos[0] = uVar10;
      if (0x40 < uVar5) goto LAB_0019350e;
      local_68.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar5 == 0) goto LAB_0019354c;
      if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
      *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar10 & 0x3f);
      local_68.ptr = (BYTE *)((uVar5 >> 3) + (long)local_68.ptr);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
      srcSize = lVar3 - 6;
    }
    iVar6 = (int)srcSize;
    if (0x15555554 < (iVar6 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar6 * -0x40000000))
    goto LAB_00193606;
    if (0 < iVar6) {
      uVar10 = srcSize & 0xffffffff;
      lVar3 = (long)src + (uVar10 - 1);
      lVar12 = (long)src + (uVar10 - 7);
      do {
        lVar4 = 5;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar3 + -5 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[0] = local_68.bitPos[0] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((uVar10 - 6) + (long)src) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] =
             uVar5 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar5 & 0x3f);
        uVar5 = uVar5 + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) goto LAB_0019350e;
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        local_68.bitContainer[1] = 0;
        local_68.bitPos[1] = 0;
        lVar4 = 5;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar12 + -5 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[1] = local_68.bitContainer[1] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[1] = local_68.bitPos[1] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((long)src + (uVar10 - 0xc)) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[1] =
             uVar5 & 0xffffffffffffff00 | local_68.bitContainer[1] >> (uVar5 & 0x3f);
        local_68.bitPos[1] = uVar5 + local_68.bitPos[1];
        if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
        if (0x3f < (local_68.bitPos[1] & 0xff)) goto LAB_001935c8;
        local_68.bitContainer[0] =
             local_68.bitContainer[0] >> (local_68.bitPos[1] & 0x3f) | local_68.bitContainer[1];
        uVar5 = local_68.bitPos[1] + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) goto LAB_001935a9;
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        srcSize = uVar10 - 0xc;
        lVar3 = lVar3 + -0xc;
        lVar12 = lVar12 + -0xc;
        bVar1 = 0xc < (long)uVar10;
        uVar10 = srcSize;
      } while (bVar1);
    }
    break;
  case 10:
    if (0 < (int)uVar7 % 5) {
      pbVar11 = (byte *)((long)(int)uVar7 + (long)src);
      iVar6 = (int)uVar7 % 5 + 1;
      do {
        pbVar11 = pbVar11 + -1;
        uVar10 = CTable[(ulong)*pbVar11 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        local_68.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        srcSize = (size_t)((int)srcSize - 1);
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      uVar10 = local_68.bitPos[0] & 0xff;
      cVar8 = (char)local_68.bitPos[0];
      local_68.bitPos[0] = (size_t)((uint)local_68.bitPos[0] & 7);
      if (uVar10 == 0) goto LAB_0019354c;
      if (0x40 < (uint)uVar10) goto LAB_00193663;
      if (local_68.endPtr < dst) goto LAB_0019356b;
      *(size_t *)dst = local_68.bitContainer[0] >> ((ulong)(byte)-cVar8 & 0x3f);
      local_68.ptr = (BYTE *)((uVar10 >> 3) + (long)dst);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
    }
    iVar6 = (int)srcSize;
    if (0x33333332 < iVar6 * -0x33333333 + 0x19999999U) goto LAB_001935e7;
    if (0x19999998 < (iVar6 * -0x33333333 + 0x19999998U >> 1 | iVar6 * -0x80000000)) {
      lVar3 = (long)iVar6;
      lVar12 = 4;
      do {
        uVar10 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar3 + -5) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar10 & 0x3f) | uVar10;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar10 = CTable[(ulong)*(byte *)((long)src + lVar3 + -5) + 1];
      if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
      local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar10 & 0x3f) | uVar10;
      uVar10 = uVar10 + local_68.bitPos[0];
      uVar5 = uVar10 & 0xff;
      local_68.bitPos[0] = uVar10;
      if (0x40 < uVar5) goto LAB_0019350e;
      local_68.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar5 == 0) goto LAB_0019354c;
      if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
      *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar10 & 0x3f);
      local_68.ptr = (BYTE *)((uVar5 >> 3) + (long)local_68.ptr);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
      srcSize = lVar3 - 5;
    }
    iVar6 = (int)srcSize;
    if (0x19999998 < (iVar6 * -0x33333333 + 0x19999998U >> 1 | iVar6 * -0x80000000))
    goto LAB_00193606;
    if (0 < iVar6) {
      uVar10 = srcSize & 0xffffffff;
      lVar3 = (long)src + (uVar10 - 1);
      lVar12 = (long)src + (uVar10 - 6);
      do {
        lVar4 = 4;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar3 + -4 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[0] = local_68.bitPos[0] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((uVar10 - 5) + (long)src) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar5 & 0x3f) | uVar5;
        uVar5 = uVar5 + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) goto LAB_0019350e;
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        local_68.bitContainer[1] = 0;
        local_68.bitPos[1] = 0;
        lVar4 = 4;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar12 + -4 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[1] = local_68.bitContainer[1] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[1] = local_68.bitPos[1] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((long)src + (uVar10 - 10)) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[1] = local_68.bitContainer[1] >> (uVar5 & 0x3f) | uVar5;
        local_68.bitPos[1] = uVar5 + local_68.bitPos[1];
        if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
        if (0x3f < (local_68.bitPos[1] & 0xff)) goto LAB_001935c8;
        local_68.bitContainer[0] =
             local_68.bitContainer[0] >> (local_68.bitPos[1] & 0x3f) | local_68.bitContainer[1];
        uVar5 = local_68.bitPos[1] + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) goto LAB_001935a9;
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        srcSize = uVar10 - 10;
        lVar3 = lVar3 + -10;
        lVar12 = lVar12 + -10;
        bVar1 = 10 < (long)uVar10;
        uVar10 = srcSize;
      } while (bVar1);
    }
    break;
  case 0xb:
    if (0 < (int)uVar7 % 5) {
      pbVar11 = (byte *)((long)(int)uVar7 + (long)src);
      iVar6 = (int)uVar7 % 5 + 1;
      do {
        pbVar11 = pbVar11 + -1;
        uVar10 = CTable[(ulong)*pbVar11 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        local_68.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        srcSize = (size_t)((int)srcSize - 1);
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      uVar10 = local_68.bitPos[0] & 0xff;
      cVar8 = (char)local_68.bitPos[0];
      local_68.bitPos[0] = (size_t)((uint)local_68.bitPos[0] & 7);
      if (uVar10 == 0) goto LAB_0019354c;
      if (0x40 < (uint)uVar10) goto LAB_00193663;
      if (local_68.endPtr < dst) goto LAB_0019356b;
      *(size_t *)dst = local_68.bitContainer[0] >> ((ulong)(byte)-cVar8 & 0x3f);
      local_68.ptr = (BYTE *)((uVar10 >> 3) + (long)dst);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
    }
    iVar6 = (int)srcSize;
    if (0x33333332 < iVar6 * -0x33333333 + 0x19999999U) goto LAB_001935e7;
    if (0x19999998 < (iVar6 * -0x33333333 + 0x19999998U >> 1 | iVar6 * -0x80000000)) {
      lVar3 = (long)iVar6;
      lVar12 = 4;
      do {
        uVar10 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar3 + -5) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar10 & 0x3f) | uVar10;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar10 = CTable[(ulong)*(byte *)((long)src + lVar3 + -5) + 1];
      if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
      local_68.bitContainer[0] =
           uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
      uVar10 = uVar10 + local_68.bitPos[0];
      uVar5 = uVar10 & 0xff;
      local_68.bitPos[0] = uVar10;
      if (0x40 < uVar5) goto LAB_0019350e;
      local_68.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar5 == 0) goto LAB_0019354c;
      if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
      *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar10 & 0x3f);
      local_68.ptr = (BYTE *)((uVar5 >> 3) + (long)local_68.ptr);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
      srcSize = lVar3 - 5;
    }
    iVar6 = (int)srcSize;
    if (0x19999998 < (iVar6 * -0x33333333 + 0x19999998U >> 1 | iVar6 * -0x80000000))
    goto LAB_00193606;
    if (0 < iVar6) {
      uVar10 = srcSize & 0xffffffff;
      lVar3 = (long)src + (uVar10 - 1);
      lVar12 = (long)src + (uVar10 - 6);
      do {
        lVar4 = 4;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar3 + -4 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[0] = local_68.bitPos[0] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((uVar10 - 5) + (long)src) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] =
             uVar5 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar5 & 0x3f);
        uVar5 = uVar5 + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) goto LAB_0019350e;
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        local_68.bitContainer[1] = 0;
        local_68.bitPos[1] = 0;
        lVar4 = 4;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar12 + -4 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[1] = local_68.bitContainer[1] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[1] = local_68.bitPos[1] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((long)src + (uVar10 - 10)) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[1] =
             uVar5 & 0xffffffffffffff00 | local_68.bitContainer[1] >> (uVar5 & 0x3f);
        local_68.bitPos[1] = uVar5 + local_68.bitPos[1];
        if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
        if (0x3f < (local_68.bitPos[1] & 0xff)) goto LAB_001935c8;
        local_68.bitContainer[0] =
             local_68.bitContainer[0] >> (local_68.bitPos[1] & 0x3f) | local_68.bitContainer[1];
        uVar5 = local_68.bitPos[1] + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) goto LAB_001935a9;
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        srcSize = uVar10 - 10;
        lVar3 = lVar3 + -10;
        lVar12 = lVar12 + -10;
        bVar1 = 10 < (long)uVar10;
        uVar10 = srcSize;
      } while (bVar1);
    }
    break;
  default:
    if (0 < (int)uVar7 % 9) {
      pbVar11 = (byte *)((long)(int)uVar7 + (long)src);
      iVar6 = (int)uVar7 % 9 + 1;
      do {
        pbVar11 = pbVar11 + -1;
        uVar10 = CTable[(ulong)*pbVar11 + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        local_68.bitContainer[0] =
             uVar10 & 0xffffffffffffff00 | local_68.bitContainer[0] >> (uVar10 & 0x3f);
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        srcSize = (size_t)((int)srcSize - 1);
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      uVar10 = local_68.bitPos[0] & 0xff;
      cVar8 = (char)local_68.bitPos[0];
      local_68.bitPos[0] = (size_t)((uint)local_68.bitPos[0] & 7);
      if (uVar10 == 0) goto LAB_0019354c;
      if (0x40 < (uint)uVar10) goto LAB_00193663;
      if (local_68.endPtr < dst) goto LAB_0019356b;
      *(size_t *)dst = local_68.bitContainer[0] >> ((ulong)(byte)-cVar8 & 0x3f);
      local_68.ptr = (BYTE *)((uVar10 >> 3) + (long)dst);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
    }
    iVar6 = (int)srcSize;
    uVar7 = iVar6 * 0x38e38e39 + 0xe38e38e;
    if (0x1c71c71c < uVar7) goto LAB_001935e7;
    if (0xe38e38e < (uVar7 >> 1 | iVar6 * -0x80000000)) {
      lVar3 = (long)iVar6;
      lVar12 = 8;
      do {
        uVar10 = CTable[(ulong)*(byte *)((long)src + lVar12 + lVar3 + -9) + 1];
        if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar10 & 0x3f) | uVar10;
        local_68.bitPos[0] = local_68.bitPos[0] + uVar10;
        if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      uVar10 = CTable[(ulong)*(byte *)((long)src + lVar3 + -9) + 1];
      if (0xc < (uVar10 & 0xff)) goto LAB_0019352d;
      local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar10 & 0x3f) | uVar10;
      uVar10 = uVar10 + local_68.bitPos[0];
      uVar5 = uVar10 & 0xff;
      local_68.bitPos[0] = uVar10;
      if (0x40 < uVar5) goto LAB_0019350e;
      local_68.bitPos[0] = (size_t)((uint)uVar10 & 7);
      if (uVar5 == 0) goto LAB_0019354c;
      if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
      *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar10 & 0x3f);
      local_68.ptr = (BYTE *)((uVar5 >> 3) + (long)local_68.ptr);
      if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
      srcSize = lVar3 - 9;
    }
    iVar6 = (int)srcSize;
    if (0xe38e38e < (iVar6 * 0x38e38e39 + 0xe38e38eU >> 1 | iVar6 * -0x80000000)) goto LAB_00193606;
    if (0 < iVar6) {
      uVar10 = srcSize & 0xffffffff;
      lVar3 = (long)src + (uVar10 - 1);
      lVar12 = (long)src + (uVar10 - 10);
      do {
        lVar4 = 8;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar3 + -8 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[0] = local_68.bitPos[0] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[0] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((uVar10 - 9) + (long)src) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[0] = local_68.bitContainer[0] >> (uVar5 & 0x3f) | uVar5;
        uVar5 = uVar5 + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) goto LAB_0019350e;
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        if (local_68.endPtr < local_68.ptr) goto LAB_0019356b;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        local_68.bitContainer[1] = 0;
        local_68.bitPos[1] = 0;
        lVar4 = 8;
        do {
          uVar5 = CTable[(ulong)*(byte *)(lVar12 + -8 + lVar4) + 1];
          if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
          local_68.bitContainer[1] = local_68.bitContainer[1] >> (uVar5 & 0x3f) | uVar5;
          local_68.bitPos[1] = local_68.bitPos[1] + uVar5;
          if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        uVar5 = CTable[(ulong)*(byte *)((long)src + (uVar10 - 0x12)) + 1];
        if (0xc < (uVar5 & 0xff)) goto LAB_0019352d;
        local_68.bitContainer[1] = local_68.bitContainer[1] >> (uVar5 & 0x3f) | uVar5;
        local_68.bitPos[1] = uVar5 + local_68.bitPos[1];
        if (0x40 < ((uint)local_68.bitPos[1] & 0xff)) goto LAB_0019350e;
        if (0x3f < (local_68.bitPos[1] & 0xff)) goto LAB_001935c8;
        local_68.bitContainer[0] =
             local_68.bitContainer[0] >> (local_68.bitPos[1] & 0x3f) | local_68.bitContainer[1];
        uVar5 = local_68.bitPos[1] + local_68.bitPos[0];
        uVar13 = uVar5 & 0xff;
        local_68.bitPos[0] = uVar5;
        if (0x40 < uVar13) goto LAB_001935a9;
        local_68.bitPos[0] = (size_t)((uint)uVar5 & 7);
        if (uVar13 == 0) goto LAB_0019354c;
        *(size_t *)local_68.ptr = local_68.bitContainer[0] >> ((ulong)(byte)-(char)uVar5 & 0x3f);
        local_68.ptr = (BYTE *)((uVar13 >> 3) + (long)local_68.ptr);
        if (local_68.endPtr < local_68.ptr) goto LAB_0019358a;
        srcSize = uVar10 - 0x12;
        lVar3 = lVar3 + -0x12;
        lVar12 = lVar12 + -0x12;
        bVar1 = 0x12 < (long)uVar10;
        uVar10 = srcSize;
      } while (bVar1);
    }
  }
LAB_00191c6d:
  if ((int)srcSize != 0) {
    __assert_fail("n == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3ecb,
                  "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                 );
  }
  if (local_68.endPtr < local_68.ptr) {
    __assert_fail("bitC.ptr <= bitC.endPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3f16,
                  "size_t HUF_compress1X_usingCTable_internal_body(void *, size_t, const void *, size_t, const HUF_CElt *)"
                 );
  }
  sVar2 = HUF_closeCStream(&local_68);
  return sVar2;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = (U32)CTable[0];
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}